

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<float>_>::Read
          (TPZSkylMatrix<std::complex<float>_> *this,TPZStream *buf,void *context)

{
  int64_t iVar1;
  int64_t iVar2;
  long *plVar3;
  TPZBaseMatrix *in_RDI;
  int64_t i;
  complex<float> *ptr;
  TPZVec<long> skyl;
  TPZVec<std::complex<float>_> *in_stack_ffffffffffffff48;
  _func_int ***ppp_Var4;
  TPZVec<long> *in_stack_ffffffffffffff50;
  TPZStream *in_stack_ffffffffffffff58;
  TPZBaseMatrix *in_stack_ffffffffffffff60;
  TPZVec<std::complex<float>_*> *in_stack_ffffffffffffff80;
  int64_t local_60;
  TPZVec<std::complex<float>_*> *local_58;
  TPZVec<long> local_38;
  
  TPZBaseMatrix::Read(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50)
  ;
  TPZStream::Read<std::complex<float>>
            ((TPZStream *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  TPZBaseMatrix::Rows(in_RDI);
  TPZVec<long>::TPZVec
            ((TPZVec<long> *)in_stack_ffffffffffffff60,(int64_t)in_stack_ffffffffffffff58,
             (long *)in_stack_ffffffffffffff50);
  TPZStream::Read<long>
            ((TPZStream *)in_stack_ffffffffffffff50,(TPZVec<long> *)in_stack_ffffffffffffff48);
  local_58 = (TPZVec<std::complex<float>_*> *)0x0;
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar1 != 0) {
    in_stack_ffffffffffffff80 =
         (TPZVec<std::complex<float>_*> *)
         TPZVec<std::complex<float>_>::operator[]((TPZVec<std::complex<float>_> *)(in_RDI + 2),0);
    local_58 = in_stack_ffffffffffffff80;
  }
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  TPZVec<std::complex<float>_*>::Resize(in_stack_ffffffffffffff80,iVar1);
  local_60 = 0;
  while( true ) {
    iVar1 = local_60;
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar2 + 1 <= iVar1) break;
    plVar3 = TPZVec<long>::operator[](&local_38,local_60);
    ppp_Var4 = &local_58->_vptr_TPZVec + *plVar3;
    in_stack_ffffffffffffff50 =
         (TPZVec<long> *)
         TPZVec<std::complex<float>_*>::operator[]
                   ((TPZVec<std::complex<float>_*> *)(in_RDI + 1),local_60);
    in_stack_ffffffffffffff50->_vptr_TPZVec = (_func_int **)ppp_Var4;
    local_60 = local_60 + 1;
  }
  TPZVec<long>::~TPZVec(in_stack_ffffffffffffff50);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::Read(TPZStream &buf, void *context )
{
    TPZMatrix<TVar>::Read(buf, context);
    buf.Read( fStorage);
    TPZVec<int64_t> skyl(this->Rows()+1,0);
    buf.Read( skyl);
    TVar *ptr = 0;
    if (this->Rows()) {
        ptr = &fStorage[0];
    }
    fElem.Resize(this->Rows()+1);
    for (int64_t i=0; i<this->Rows()+1; i++) {
        fElem[i] = skyl[i] + ptr;
    }
}